

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestService_Stub::Foo
          (TestService_Stub *this,RpcController *controller,FooRequest *request,
          FooResponse *response,Closure *done)

{
  RpcChannel *pRVar1;
  ServiceDescriptor *this_00;
  MethodDescriptor *pMVar2;
  
  pRVar1 = this->channel_;
  this_00 = TestService::descriptor();
  pMVar2 = google::protobuf::ServiceDescriptor::method(this_00,0);
  (*pRVar1->_vptr_RpcChannel[2])(pRVar1,pMVar2,controller,request,response,done);
  return;
}

Assistant:

void TestService_Stub::Foo(
    ::google::protobuf::RpcController* PROTOBUF_NULLABLE controller,
    const ::proto2_unittest::FooRequest* PROTOBUF_NONNULL request, ::proto2_unittest::FooResponse* PROTOBUF_NONNULL response,
    ::google::protobuf::Closure* PROTOBUF_NULLABLE done) {
  channel_->CallMethod(descriptor()->method(0), controller,
                       request, response, done);
}